

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O0

void __thiscall BanSearchIRCCommand::create(BanSearchIRCCommand *this)

{
  basic_string_view<char,_std::char_traits<char>_> bVar1;
  size_t local_70;
  char *local_68;
  size_t local_60;
  char *local_58;
  size_t local_50;
  char *local_48;
  size_t local_40;
  char *local_38;
  size_t local_30;
  char *local_28;
  size_t local_20;
  char *local_18;
  BanSearchIRCCommand *this_local;
  
  bVar1 = sv("bansearch",9);
  local_20 = bVar1._M_len;
  local_18 = bVar1._M_str;
  Jupiter::Command::addTrigger(this,local_20,local_18);
  bVar1 = sv("bsearch",7);
  local_30 = bVar1._M_len;
  local_28 = bVar1._M_str;
  Jupiter::Command::addTrigger(this,local_30,local_28);
  bVar1 = sv("banfind",7);
  local_40 = bVar1._M_len;
  local_38 = bVar1._M_str;
  Jupiter::Command::addTrigger(this,local_40,local_38);
  bVar1 = sv("bfind",5);
  local_50 = bVar1._M_len;
  local_48 = bVar1._M_str;
  Jupiter::Command::addTrigger(this,local_50,local_48);
  bVar1 = sv("banlogs",7);
  local_60 = bVar1._M_len;
  local_58 = bVar1._M_str;
  Jupiter::Command::addTrigger(this,local_60,local_58);
  bVar1 = sv("blogs",5);
  local_70 = bVar1._M_len;
  local_68 = bVar1._M_str;
  Jupiter::Command::addTrigger(this,local_70,local_68);
  IRCCommand::setAccessLevel((int)this);
  return;
}

Assistant:

void BanSearchIRCCommand::create() {
	this->addTrigger("bansearch"sv);
	this->addTrigger("bsearch"sv);
	this->addTrigger("banfind"sv);
	this->addTrigger("bfind"sv);
	this->addTrigger("banlogs"sv);
	this->addTrigger("blogs"sv);
	this->setAccessLevel(2);
}